

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::Array<unsigned_int>::Array(Array<unsigned_int> *this,Array<unsigned_int> *src)

{
  bool bVar1;
  SizeT SVar2;
  Array<unsigned_int> *src_local;
  Array<unsigned_int> *this_local;
  
  this->storage_ = (uint *)0x0;
  this->index_ = 0;
  SVar2 = Size(src);
  this->capacity_ = SVar2;
  bVar1 = IsNotEmpty(src);
  if (bVar1) {
    SVar2 = Size(src);
    setSize(this,SVar2);
    copyArray(this,src);
  }
  return;
}

Assistant:

Array(const Array &src) : capacity_{src.Size()} {
        if (src.IsNotEmpty()) {
            setSize(src.Size());
            copyArray(src);
        }
    }